

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::StartStruct(Parser *this,string *name,StructDef **dest)

{
  StructDef *pSVar1;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  _Var2;
  undefined8 *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  pSVar1 = LookupCreateStruct((Parser *)name,(string *)dest,true,true);
  if (pSVar1->predecl == false) {
    Namespace::GetFullyQualifiedName
              (&local_48,*(Namespace **)((long)&name[0xc].field_2 + 8),(string *)dest,1000);
    std::operator+(&local_68,"datatype already exists: ",&local_48);
    Error(this,name);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    pSVar1->predecl = false;
    std::__cxx11::string::_M_assign((string *)pSVar1);
    std::__cxx11::string::_M_assign((string *)&(pSVar1->super_Definition).file);
    local_68._M_dataplus._M_p = (pointer)pSVar1;
    _Var2 = std::
            __remove_if<__gnu_cxx::__normal_iterator<flatbuffers::StructDef**,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>,__gnu_cxx::__ops::_Iter_equals_val<flatbuffers::StructDef*const>>
                      (*(StructDef ***)((long)&name[6].field_2 + 8),
                       (__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        )name[7]._M_dataplus._M_p,
                       (_Iter_equals_val<flatbuffers::StructDef_*const>)&local_68);
    *_Var2._M_current = pSVar1;
    *in_RCX = pSVar1;
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::StartStruct(const std::string &name, StructDef **dest) {
  auto &struct_def = *LookupCreateStruct(name, true, true);
  if (!struct_def.predecl)
    return Error("datatype already exists: " +
                 current_namespace_->GetFullyQualifiedName(name));
  struct_def.predecl = false;
  struct_def.name = name;
  struct_def.file = file_being_parsed_;
  // Move this struct to the back of the vector just in case it was predeclared,
  // to preserve declaration order.
  *std::remove(structs_.vec.begin(), structs_.vec.end(), &struct_def) =
      &struct_def;
  *dest = &struct_def;
  return NoError();
}